

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void key_iterator_suite::iterate_map(void)

{
  bool bVar1;
  type v;
  const_reference lhs;
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1c0;
  key_iterator local_1b8;
  key_iterator local_168;
  undefined1 local_118 [8];
  key_iterator where;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [24];
  variable data;
  
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[6],_true>
            (&local_a8,(char (*) [4])"key",(char (*) [6])"alpha");
  local_48._0_8_ = &local_a8;
  local_48._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_1c0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_1c0 = local_1c0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1c0);
  } while (local_1c0 != &local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            ((key_iterator *)local_118,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_168,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_118,&local_168);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc73,"void key_iterator_suite::iterate_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_168);
  lhs = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                  ((key_iterator *)local_118);
  v = trial::dynamic::operator==(lhs,(char (*) [4])"key");
  boost::detail::test_impl
            ("*where == \"key\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc74,"void key_iterator_suite::iterate_map()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator++
            ((key_iterator *)local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_1b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator==
                    ((key_iterator *)local_118,&local_1b8);
  boost::detail::test_impl
            ("where == data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc76,"void key_iterator_suite::iterate_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void iterate_map()
{
    variable data = map::make(
        {
            {"key", "alpha"}
        });
    auto where = data.key_begin();
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == "key");
    ++where;
    TRIAL_PROTOCOL_TEST(where == data.key_end());
}